

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::push_if(CTcTokenizer *this,tok_if_t state)

{
  int iVar1;
  tok_if_t in_ESI;
  CTcTokenizer *in_RDI;
  
  if (in_RDI->if_sp_ == 100) {
    throw_fatal_error(0x2721);
  }
  iVar1 = in_false_if(in_RDI);
  if (iVar1 != 0) {
    in_RDI->if_false_level_ = in_RDI->if_false_level_ + 1;
  }
  in_RDI->if_stack_[in_RDI->if_sp_].desc = in_RDI->last_desc_;
  in_RDI->if_stack_[in_RDI->if_sp_].linenum = in_RDI->last_linenum_;
  iVar1 = in_RDI->if_sp_;
  in_RDI->if_sp_ = iVar1 + 1;
  in_RDI->if_stack_[iVar1].state = in_ESI;
  return;
}

Assistant:

void CTcTokenizer::push_if(tok_if_t state)
{
    /* if we're out of space in the stack, throw a fatal error */
    if (if_sp_ == TOK_MAX_IF_NESTING)
        throw_fatal_error(TCERR_IF_NESTING_OVERFLOW);

    /* 
     *   if we're in a nested #if in a false #if, increase the nested
     *   false #if level 
     */
    if (in_false_if())
        ++if_false_level_;

    /* push the state, remembering where the #if was defined */
    if_stack_[if_sp_].desc = last_desc_;
    if_stack_[if_sp_].linenum = last_linenum_;
    if_stack_[if_sp_++].state = state;
}